

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

QSize __thiscall QToolBoxButton::minimumSizeHint(QToolBoxButton *this)

{
  byte bVar1;
  QStyle *pQVar2;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  int icone;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QSize *in_stack_ffffffffffffffc0;
  QAbstractButton *in_stack_ffffffffffffffc8;
  QIcon local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractButton::icon(in_stack_ffffffffffffffc8);
  bVar1 = QIcon::isNull();
  QIcon::~QIcon(&local_18);
  if ((bVar1 & 1) == 0) {
    pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           );
    pQVar3 = QWidget::parentWidget((QWidget *)0x7029d6);
    (**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,0x3e,0,pQVar3);
    QSize::QSize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  else {
    QSize::QSize(in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBoxButton::minimumSizeHint() const
{
    if (icon().isNull())
        return QSize();
    int icone = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, parentWidget() /* QToolBox */);
    return QSize(icone + 8, icone + 8);
}